

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

bool __thiscall GGSock::FileServer::Impl::updateFileInfos(Impl *this)

{
  mapped_type *pmVar1;
  pointer pFVar2;
  int iVar3;
  ulong uVar4;
  pointer pFVar5;
  key_type_conflict local_3c;
  TFileInfos *local_38;
  
  local_38 = &this->fileInfos;
  std::
  _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::FileInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::FileInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
  ::clear(&local_38->_M_t);
  local_3c = 0;
  pFVar5 = (this->files).
           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (this->files).
           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pFVar2 - (long)pFVar5) >> 3) * -0x3b13b13b) {
    do {
      uVar4 = (ulong)local_3c;
      iVar3 = local_3c + 0x3f;
      if (-1 < local_3c) {
        iVar3 = local_3c;
      }
      if (((this->fileUsed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar3 >> 6) +
            (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar4 & 0x3f) & 1) != 0) {
        pmVar1 = std::
                 map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
                 ::operator[](local_38,&local_3c);
        std::__cxx11::string::_M_assign((string *)pmVar1);
        pmVar1->filesize = pFVar5[uVar4].info.filesize;
        std::__cxx11::string::_M_assign((string *)&pmVar1->filename);
        pmVar1->nChunks = pFVar5[uVar4].info.nChunks;
        pFVar5 = (this->files).
                 super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar2 = (this->files).
                 super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_3c = local_3c + 1;
      iVar3 = (int)((ulong)((long)pFVar2 - (long)pFVar5) >> 3);
    } while (SBORROW4(local_3c,iVar3 * -0x3b13b13b) != local_3c + iVar3 * 0x3b13b13b < 0);
  }
  return true;
}

Assistant:

bool updateFileInfos() {
        fileInfos.clear();

        for (int i = 0; i < (int) files.size(); ++i) {
            if (fileUsed[i] == false) {
                continue;
            }
            const auto & file = files[i];
            fileInfos[i] = file.info;
        }

        return true;
    }